

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_merge_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::BlockMergePass::Process(BlockMergePass *this)

{
  bool bVar1;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/block_merge_pass.cpp:43:25)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/block_merge_pass.cpp:43:25)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  bVar1 = IRContext::ProcessReachableCallTree
                    ((this->super_Pass).context_,(ProcessFunction *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return bVar1 ^ SuccessWithoutChange;
}

Assistant:

Pass::Status BlockMergePass::Process() {
  // Process all entry point functions.
  ProcessFunction pfn = [this](Function* fp) { return MergeBlocks(fp); };
  bool modified = context()->ProcessReachableCallTree(pfn);
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}